

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O3

void ImPlot::ShowAxisMetrics(ImPlotAxis *axis,bool show_axis_rects)

{
  ImDrawList *this;
  undefined7 in_register_00000031;
  char *pcVar1;
  char *pcVar2;
  
  ImGui::Bullet();
  ImGui::Text("Flags:      %d",(ulong)(uint)axis->Flags);
  ImGui::Bullet();
  ImGui::Text("Range:      [%f,%f]",(axis->Range).Min,(axis->Range).Max);
  ImGui::Bullet();
  ImGui::Text("Pixels:     %f",(double)axis->Pixels);
  ImGui::Bullet();
  ImGui::Text("Aspect:     %f",((axis->Range).Max - (axis->Range).Min) / (double)axis->Pixels);
  ImGui::Bullet();
  pcVar2 = "false";
  pcVar1 = "false";
  if (axis->Dragging != false) {
    pcVar1 = "true";
  }
  ImGui::Text("Dragging:   %s",pcVar1);
  ImGui::Bullet();
  pcVar1 = "false";
  if (axis->ExtHovered != false) {
    pcVar1 = "true";
  }
  ImGui::Text("ExtHovered: %s",pcVar1);
  ImGui::Bullet();
  pcVar1 = "false";
  if (axis->AllHovered != false) {
    pcVar1 = "true";
  }
  ImGui::Text("AllHovered: %s",pcVar1);
  ImGui::Bullet();
  pcVar1 = "false";
  if (axis->Present != false) {
    pcVar1 = "true";
  }
  ImGui::Text("Present:    %s",pcVar1);
  ImGui::Bullet();
  if (axis->HasRange != false) {
    pcVar2 = "true";
  }
  ImGui::Text("HasRange:   %s",pcVar2);
  ImGui::Bullet();
  ImGui::Text("LinkedMin:  %p",axis->LinkedMin);
  ImGui::Bullet();
  ImGui::Text("LinkedMax:  %p",axis->LinkedMax);
  if ((int)CONCAT71(in_register_00000031,show_axis_rects) != 0) {
    this = ImGui::GetForegroundDrawList();
    ImDrawList::AddRect(this,&(axis->HoverRect).Min,&(axis->HoverRect).Max,0xff00ff00,0.0,0,1.0);
    return;
  }
  return;
}

Assistant:

void ShowAxisMetrics(ImPlotAxis* axis, bool show_axis_rects) {
    ImGui::Bullet(); ImGui::Text("Flags:      %d", axis->Flags);
    ImGui::Bullet(); ImGui::Text("Range:      [%f,%f]",axis->Range.Min, axis->Range.Max);
    ImGui::Bullet(); ImGui::Text("Pixels:     %f", axis->Pixels);
    ImGui::Bullet(); ImGui::Text("Aspect:     %f", axis->GetAspect());
    ImGui::Bullet(); ImGui::Text("Dragging:   %s", axis->Dragging ? "true" : "false");
    ImGui::Bullet(); ImGui::Text("ExtHovered: %s", axis->ExtHovered ? "true" : "false");
    ImGui::Bullet(); ImGui::Text("AllHovered: %s", axis->AllHovered ? "true" : "false");
    ImGui::Bullet(); ImGui::Text("Present:    %s", axis->Present ? "true" : "false");
    ImGui::Bullet(); ImGui::Text("HasRange:   %s", axis->HasRange ? "true" : "false");
    ImGui::Bullet(); ImGui::Text("LinkedMin:  %p", (void*)axis->LinkedMin);
    ImGui::Bullet(); ImGui::Text("LinkedMax:  %p", (void*)axis->LinkedMax);
    if (show_axis_rects) {
        ImDrawList& fg = *ImGui::GetForegroundDrawList();
        fg.AddRect(axis->HoverRect.Min, axis->HoverRect.Max, IM_COL32(0,255,0,255));
    }
}